

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu382.c
# Opt level: O1

MPP_RET hal_h265d_vdpu382_gen_regs(void *hal,HalTaskInfo *syn)

{
  undefined1 *puVar1;
  SWREG12_SENCODARY_EN_conflict *pSVar2;
  SWREG10_DEC_E *pSVar3;
  SWREG11_IMPORTANT_EN_conflict *pSVar4;
  SWREG26_BLOCK_GATING_EN_conflict *pSVar5;
  SWREG21_ERROR_CTRL_SET *pSVar6;
  SWREG103_HEVC_MVC0 *pSVar7;
  SWREG99_HEVC_REF_VALID *pSVar8;
  ushort *dxva;
  Vdpu382H265dRegSet *hw_regs;
  ushort *puVar9;
  HalBufs *ppvVar10;
  undefined2 uVar11;
  RK_S32 max_cnt;
  MppFrameFormat MVar12;
  RK_U32 RVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  SWREG201_REF8_15_POC_HIGHBIT SVar17;
  SWREG200_REF0_7_POC_HIGHBIT SVar18;
  long lVar19;
  void *pvVar20;
  HalBuf *pHVar21;
  void *pvVar22;
  size_t sVar23;
  undefined8 *puVar24;
  byte bVar25;
  long lVar26;
  char *fmt;
  uint uVar27;
  ulong uVar28;
  RK_U32 RVar29;
  MppFrame mframe;
  MppBuffer framebuf;
  MppBuffer streambuf;
  MppFrame local_70;
  MppBuffer local_68;
  MppBuffer local_60;
  Vdpu382RegCommonAddr *local_58;
  void *local_50;
  RK_U32 local_44;
  int local_40;
  int local_3c;
  HalBufs *local_38;
  
  local_60 = (MppBuffer)0x0;
  local_68 = (MppBuffer)0x0;
  if ((((syn->dec).flags.val & 4) != 0) ||
     ((dxva = (ushort *)(syn->dec).syntax.data, ((syn->dec).flags.val & 8) != 0 &&
      (*(int *)(*(long *)((long)hal + 0x18) + 0x30) == 0)))) {
    if (((byte)hal_h265d_debug & 0x20) != 0) {
      _mpp_log_l(4,"hal_h265d_vdpu382","%s found task error\n",(char *)0x0,
                 "hal_h265d_vdpu382_gen_regs");
      return MPP_OK;
    }
    return MPP_OK;
  }
  if (*(int *)((long)hal + 0x180) != 0) {
    lVar19 = -0x78;
    lVar26 = 0;
    do {
      if (*(int *)((long)hal + lVar19 + 0x180) == 0) {
        (syn->dec).reg_index = (RK_S32)lVar26;
        *(undefined4 *)((long)hal + 0x1fc) = *(undefined4 *)((long)hal + lVar26 * 4 + 0x1d8);
        *(undefined4 *)((long)hal + 0x200) = *(undefined4 *)((long)hal + lVar26 * 4 + 0x1e4);
        *(undefined4 *)((long)hal + 0x204) = *(undefined4 *)((long)hal + lVar26 * 4 + 0x1f0);
        *(undefined8 *)((long)hal + 0x100) = *(undefined8 *)((long)hal + lVar19 + 0x1a0);
        *(undefined4 *)((long)hal + lVar19 + 0x180) = 1;
        if (lVar19 != 0) goto LAB_001f49e0;
        break;
      }
      lVar26 = lVar26 + 1;
      lVar19 = lVar19 + 0x28;
    } while (lVar19 != 0);
    fmt = "hevc rps buf all used";
LAB_001f4abc:
    _mpp_log_l(2,"hal_h265d_vdpu382",fmt,(char *)0x0);
    return MPP_ERR_NOMEM;
  }
  (syn->dec).reg_index = 0;
LAB_001f49e0:
  pvVar20 = mpp_buffer_get_ptr_with_caller
                      (*(MppBuffer *)((long)hal + 0x1c8),"hal_h265d_vdpu382_gen_regs");
  if (pvVar20 == (void *)0x0) {
    fmt = "rps_data get ptr error";
    goto LAB_001f4abc;
  }
  if ((syn->dec).syntax.data == (void *)0x0) {
    _mpp_log_l(2,"hal_h265d_vdpu382","%s:%s:%d dxva is NULL",(char *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/HermanChen[P]mpp/mpp/hal/rkdec/h265d/hal_h265d_vdpu382.c"
               ,"hal_h265d_vdpu382_gen_regs",0x2c1);
    return MPP_ERR_NULL_PTR;
  }
  uVar14 = *(uint *)((long)hal + 0x200);
  hw_regs = *(Vdpu382H265dRegSet **)((long)hal + 0x100);
  memset(hw_regs,0,700);
  if (*(long *)((long)hal + 0x100) == 0) {
    return MPP_ERR_NULL_PTR;
  }
  bVar25 = (char)dxva[4] + 3;
  local_3c = (uint)*dxva << (bVar25 & 0x1f);
  local_40 = (uint)dxva[1] << (bVar25 & 0x1f);
  puVar9 = (ushort *)(syn->dec).syntax.data;
  bVar25 = (char)*(undefined4 *)(puVar9 + 4) + 3;
  if (*(long *)((long)hal + 0x230) == 0) {
    RVar29 = 1;
  }
  else {
    RVar29 = *(uint *)(*(long *)((long)hal + 0x230) + 4) >> 0xe & 1;
  }
  local_58 = (Vdpu382RegCommonAddr *)(ulong)uVar14;
  local_50 = pvVar20;
  RVar29 = vdpu382_get_colmv_size
                     ((uint)*puVar9 << (bVar25 & 0x1f),(uint)puVar9[1] << (bVar25 & 0x1f),
                      8 << (*(char *)((long)puVar9 + 9) + (char)*(undefined4 *)(puVar9 + 4) & 0x1fU)
                      & 0xf8,0x10,0x10,RVar29);
  local_38 = (HalBufs *)((long)hal + 0x1a8);
  if (*(HalBufs *)((long)hal + 0x1a8) == (HalBufs)0x0) {
    local_70 = (MppFrame)(ulong)RVar29;
  }
  else {
    if (RVar29 <= *(uint *)((long)hal + 0x1b0)) goto LAB_001f4bdf;
    local_70 = (MppFrame)(ulong)RVar29;
    hal_bufs_deinit(*(HalBufs *)((long)hal + 0x1a8));
    *local_38 = (HalBufs)0x0;
  }
  ppvVar10 = local_38;
  hal_bufs_init(local_38);
  if (*ppvVar10 == (HalBufs)0x0) {
    _mpp_log_l(2,"hal_h265d_vdpu382","colmv bufs init fail","hal_h265d_vdpu382_setup_colmv_buf");
    return MPP_ERR_NOMEM;
  }
  *(RK_U32 *)((long)hal + 0x1b0) = RVar29;
  max_cnt = mpp_buf_slot_get_count(*(MppBufSlots *)((long)hal + 0x20));
  *(RK_S32 *)((long)hal + 0x1b4) = max_cnt;
  hal_bufs_setup(*(HalBufs *)((long)hal + 0x1a8),max_cnt,1,(size_t *)&local_70);
LAB_001f4bdf:
  local_70 = (MppFrame)0x0;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x20),(byte)dxva[3] & 0x7f,SLOT_FRAME_PTR,&local_70);
  local_44 = mpp_frame_get_hor_stride(local_70);
  RVar29 = mpp_frame_get_ver_stride(local_70);
  puVar1 = &(hw_regs->common).reg013.field_0x2;
  *puVar1 = *puVar1 | 4;
  (hw_regs->common).reg021 =
       (SWREG21_ERROR_CTRL_SET)((uint)(hw_regs->common).reg021 & 0xfffffff8 | 6);
  (hw_regs->common).reg017 =
       (SWREG17_SLICE_NUMBER)
       ((uint)(hw_regs->common).reg017 & 0xfe000000 | *(uint *)(dxva + 0xf2a) & 0x1ffffff);
  *(byte *)&(hw_regs->h265d_param).reg64 = *(byte *)&(hw_regs->h265d_param).reg64 & 0xf8;
  MVar12 = mpp_frame_get_fmt(local_70);
  if ((MVar12 & 0xf00000) == MPP_FMT_YUV420SP) {
    pSVar2 = &(hw_regs->common).reg012;
    *(byte *)pSVar2 = *(byte *)pSVar2 & 0xfb;
    uVar11 = (undefined2)(local_44 >> 4);
    *(undefined2 *)&(hw_regs->common).reg018 = uVar11;
    *(undefined2 *)&(hw_regs->common).reg019 = uVar11;
    uVar27 = RVar29 * local_44 >> 4;
    uVar14 = 0xf0000000;
  }
  else {
    RVar13 = mpp_frame_get_fbc_hdr_stride(local_70);
    pSVar2 = &(hw_regs->common).reg012;
    *(byte *)pSVar2 = *(byte *)pSVar2 | 4;
    uVar11 = (undefined2)(RVar13 >> 4);
    *(undefined2 *)&(hw_regs->common).reg018 = uVar11;
    *(undefined2 *)&(hw_regs->common).reg019 = uVar11;
    uVar27 = ((RVar29 + 0x40) * RVar13 >> 4) + 0xfff & 0x1ffff000;
    uVar14 = 0xf;
  }
  (hw_regs->common).field_12 =
       (anon_union_4_2_0d70da0d_for_Vdpu382RegCommon_t_12)
       (uVar14 & (uint)(hw_regs->common).field_12 | uVar27);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x20),(byte)dxva[3] & 0x7f,SLOT_BUFFER,&local_68);
  RVar29 = mpp_buffer_get_fd_with_caller(local_68,"hal_h265d_vdpu382_gen_regs");
  (hw_regs->common_addr).reg130_decout_base = RVar29;
  if (RVar29 != 0) {
    pvVar20 = (void *)((long)local_50 + (long)local_58);
    RVar29 = mpp_buffer_get_fd_with_caller(local_68,"hal_h265d_vdpu382_gen_regs");
    (hw_regs->common_addr).reg130_decout_base = RVar29;
    pHVar21 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x1a8),(byte)dxva[3] & 0x7f);
    RVar29 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"hal_h265d_vdpu382_gen_regs");
    (hw_regs->common_addr).reg131_colmv_cur_base = RVar29;
    (hw_regs->h265d_param).reg65 = *(SWREG65_CUR_POC *)(dxva + 0x3c);
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x28),(syn->dec).input,SLOT_BUFFER,&local_60)
    ;
    if (*(long *)(dxva + 0xf30) == 0) {
      pvVar22 = mpp_buffer_get_ptr_with_caller(local_60,"hal_h265d_vdpu382_gen_regs");
      *(void **)(dxva + 0xf30) = pvVar22;
    }
    pSVar7 = &(hw_regs->h265d_param).reg103;
    *pSVar7 = (SWREG103_HEVC_MVC0)((uint)*pSVar7 | 0xffff);
    hal_h265d_slice_hw_rps
              ((syn->dec).syntax.data,pvVar20,*(void **)((long)hal + 0x210),
               *(RK_U32 *)((long)hal + 0x180));
    RVar29 = *(RK_U32 *)((long)hal + 0x1d0);
    (hw_regs->h265d_addr).reg197_cabactbl_base = RVar29;
    (hw_regs->h265d_addr).reg161_pps_base = RVar29;
    (hw_regs->h265d_addr).reg163_rps_base = RVar29;
    RVar29 = mpp_buffer_get_fd_with_caller(local_60,"hal_h265d_vdpu382_gen_regs");
    (hw_regs->common_addr).reg128_rlc_base = RVar29;
    RVar29 = mpp_buffer_get_fd_with_caller(local_60,"hal_h265d_vdpu382_gen_regs");
    (hw_regs->common_addr).reg129_rlcwrite_base = RVar29;
    sVar23 = mpp_buffer_get_size_with_caller(local_60,"hal_h265d_vdpu382_gen_regs");
    uVar14 = *(uint *)(dxva + 0xf34);
    uVar27 = (uVar14 + 0xf & 0xfffffff0) + 0x40;
    if ((uint)sVar23 <= uVar27) {
      uVar27 = (uint)sVar23;
    }
    (hw_regs->common).reg016_str_len = uVar27;
    if (0 < (int)(uVar27 - uVar14)) {
      memset((void *)((ulong)uVar14 + *(long *)(dxva + 0xf30)),0,(ulong)(uVar27 - uVar14));
    }
    pSVar3 = &(hw_regs->common).reg010;
    *(byte *)pSVar3 = *(byte *)pSVar3 | 1;
    if (*(long *)((long)hal + 0x230) == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = *(uint *)(*(long *)((long)hal + 0x230) + 4) >> 0xd & 2;
    }
    local_58 = &hw_regs->common_addr;
    RVar29 = (hw_regs->common_addr).reg130_decout_base;
    (hw_regs->common).reg012 =
         (SWREG12_SENCODARY_EN_conflict)((uint)(hw_regs->common).reg012 & 0xfffffffd | uVar14);
    (hw_regs->common).reg024 = (SWREG24_CABAC_ERROR_EN_LOWBITS)0xffffdfff;
    (hw_regs->common).reg025 =
         (SWREG25_CABAC_ERROR_EN_HIGHBITS)((uint)(hw_regs->common).reg025 & 0xc0000000 | 0x3ffbf9ff)
    ;
    pSVar4 = &(hw_regs->common).reg011;
    *pSVar4 = (SWREG11_IMPORTANT_EN_conflict)((uint)*pSVar4 | 0xc00002);
    pSVar5 = &(hw_regs->common).reg026;
    *pSVar5 = (SWREG26_BLOCK_GATING_EN_conflict)((uint)*pSVar5 | 0x80030f1f);
    (hw_regs->common).reg032_timeout_threshold = 0x3ffff;
    *(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3) = (byte)dxva[3] & 0x7f;
    (hw_regs->common_addr).reg132_error_ref_base = RVar29;
    (hw_regs->highpoc).reg205 = (SWREG205_DEBUG_INFO)0x0;
    local_50._0_4_ = 0x7fffffff;
    uVar28 = 0;
    do {
      if ((*(byte *)((long)dxva + uVar28 + 0x7c) | 0x80) != 0xff) {
        local_70 = (MppFrame)0x0;
        (hw_regs->h265d_param).reg67_82_ref_poc[uVar28] = *(RK_U32 *)(dxva + uVar28 * 2 + 0x46);
        mpp_buf_slot_get_prop
                  (*(MppBufSlots *)((long)hal + 0x20),*(byte *)((long)dxva + uVar28 + 0x7c) & 0x7f,
                   SLOT_BUFFER,&local_68);
        mpp_buf_slot_get_prop
                  (*(MppBufSlots *)((long)hal + 0x20),*(byte *)((long)dxva + uVar28 + 0x7c) & 0x7f,
                   SLOT_FRAME_PTR,&local_70);
        if (local_68 == (MppBuffer)0x0) {
          (hw_regs->h265d_addr).reg164_179_ref_base[uVar28] = RVar29;
        }
        else {
          RVar29 = mpp_buffer_get_fd_with_caller(local_68,"hal_h265d_vdpu382_gen_regs");
          (hw_regs->h265d_addr).reg164_179_ref_base[uVar28] = RVar29;
          iVar15 = *(int *)(dxva + uVar28 * 2 + 0x46) - *(int *)(dxva + 0x7a);
          iVar16 = -iVar15;
          if (0 < iVar15) {
            iVar16 = iVar15;
          }
          if ((iVar16 < (int)local_50) && (RVar13 = mpp_frame_get_errinfo(local_70), RVar13 == 0)) {
            iVar16 = *(int *)(dxva + uVar28 * 2 + 0x46) - *(int *)(dxva + 0x7a);
            local_50._0_4_ = -iVar16;
            if (0 < iVar16) {
              local_50._0_4_ = iVar16;
            }
            (hw_regs->common_addr).reg132_error_ref_base =
                 (hw_regs->h265d_addr).reg164_179_ref_base[uVar28];
            *(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3) =
                 *(byte *)((long)dxva + uVar28 + 0x7c) & 0x7f;
            pSVar6 = &(hw_regs->common).reg021;
            *(byte *)pSVar6 = *(byte *)pSVar6 & 0xfd;
          }
        }
        pHVar21 = hal_bufs_get_buf(*local_38,*(byte *)((long)dxva + uVar28 + 0x7c) & 0x7f);
        RVar13 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"hal_h265d_vdpu382_gen_regs");
        (hw_regs->h265d_addr).reg181_196_colmv_base[uVar28] = RVar13;
        switch(uVar28 & 0xffffffff) {
        case 0:
          uVar14 = 1;
          break;
        case 1:
          uVar14 = 2;
          break;
        case 2:
          uVar14 = 4;
          break;
        case 3:
          uVar14 = 8;
          break;
        case 4:
          uVar14 = 0x100;
          break;
        case 5:
          uVar14 = 0x200;
          break;
        case 6:
          uVar14 = 0x400;
          break;
        case 7:
          uVar14 = 0x800;
          break;
        case 8:
          uVar14 = 0x10000;
          break;
        case 9:
          uVar14 = 0x20000;
          break;
        case 10:
          uVar14 = 0x40000;
          break;
        case 0xb:
          uVar14 = 0x80000;
          break;
        case 0xc:
          uVar14 = 0x1000000;
          break;
        case 0xd:
          uVar14 = 0x2000000;
          break;
        case 0xe:
          uVar14 = 0x4000000;
          break;
        default:
          goto switchD_001f5046_default;
        }
        pSVar8 = &(hw_regs->h265d_param).reg99;
        *pSVar8 = (SWREG99_HEVC_REF_VALID)((uint)*pSVar8 | uVar14);
      }
switchD_001f5046_default:
      uVar28 = uVar28 + 1;
    } while (uVar28 != 0xf);
    if ((*(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3) != ((byte)dxva[3] & 0x7f)) ||
       ((dxva[0xf] & 4) != 0)) {
      lVar19 = 0x7c;
      do {
        if ((*(byte *)((long)dxva + lVar19) | 0x80) != 0xff) {
          local_70 = (MppFrame)0x0;
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)((long)hal + 0x20),*(byte *)((long)dxva + lVar19) & 0x7f,
                     SLOT_BUFFER,&local_68);
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)((long)hal + 0x20),*(byte *)((long)dxva + lVar19) & 0x7f,
                     SLOT_FRAME_PTR,&local_70);
          if ((local_68 == (MppBuffer)0x0) ||
             (RVar29 = mpp_frame_get_errinfo(local_70), RVar29 != 0)) {
            pHVar21 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x1a8),
                                       (uint)*(byte *)((long)hal +
                                                      (long)(syn->dec).reg_index + 0x1c3));
            *(RK_U32 *)((long)hw_regs + lVar19 * 4 + -0x6c) =
                 (hw_regs->common_addr).reg132_error_ref_base;
            iVar16 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"hal_h265d_vdpu382_gen_regs");
            *(int *)((long)hw_regs + lVar19 * 4 + -0x28) = iVar16;
          }
          goto switchD_001f51a3_default;
        }
        pHVar21 = hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x1a8),
                                   (uint)*(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3));
        *(RK_U32 *)((long)hw_regs + lVar19 * 4 + -0x6c) =
             (hw_regs->common_addr).reg132_error_ref_base;
        iVar16 = mpp_buffer_get_fd_with_caller(*pHVar21->buf,"hal_h265d_vdpu382_gen_regs");
        *(int *)((long)hw_regs + lVar19 * 4 + -0x28) = iVar16;
        if (*(byte *)((long)hal + (long)(syn->dec).reg_index + 0x1c3) != ((byte)dxva[3] & 0x7f))
        goto switchD_001f51a3_default;
        switch(lVar19 - 0x7cU & 0xffffffff) {
        case 0:
          SVar18 = (SWREG200_REF0_7_POC_HIGHBIT)((uint)(hw_regs->highpoc).reg200 & 0xfffffff0 | 3);
          break;
        case 1:
          SVar18 = (SWREG200_REF0_7_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg200 & 0xffffff0f | 0x30);
          break;
        case 2:
          SVar18 = (SWREG200_REF0_7_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg200 & 0xfffff0ff | 0x300);
          break;
        case 3:
          SVar18 = (SWREG200_REF0_7_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg200 & 0xffff0fff | 0x3000);
          break;
        case 4:
          SVar18 = (SWREG200_REF0_7_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg200 & 0xfff0ffff | 0x30000);
          break;
        case 5:
          SVar18 = (SWREG200_REF0_7_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg200 & 0xff0fffff | 0x300000);
          break;
        case 6:
          SVar18 = (SWREG200_REF0_7_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg200 & 0xf0ffffff | 0x3000000);
          break;
        case 7:
          SVar18 = (SWREG200_REF0_7_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg200 & 0xfffffff | 0x30000000);
          break;
        case 8:
          SVar17 = (SWREG201_REF8_15_POC_HIGHBIT)((uint)(hw_regs->highpoc).reg201 & 0xfffffff0 | 3);
          goto LAB_001f5391;
        case 9:
          SVar17 = (SWREG201_REF8_15_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg201 & 0xffffff0f | 0x30);
          goto LAB_001f5391;
        case 10:
          SVar17 = (SWREG201_REF8_15_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg201 & 0xfffff0ff | 0x300);
          goto LAB_001f5391;
        case 0xb:
          SVar17 = (SWREG201_REF8_15_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg201 & 0xffff0fff | 0x3000);
          goto LAB_001f5391;
        case 0xc:
          SVar17 = (SWREG201_REF8_15_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg201 & 0xfff0ffff | 0x30000);
          goto LAB_001f5391;
        case 0xd:
          SVar17 = (SWREG201_REF8_15_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg201 & 0xff0fffff | 0x300000);
          goto LAB_001f5391;
        case 0xe:
          SVar17 = (SWREG201_REF8_15_POC_HIGHBIT)
                   ((uint)(hw_regs->highpoc).reg201 & 0xf0ffffff | 0x3000000);
LAB_001f5391:
          (hw_regs->highpoc).reg201 = SVar17;
        default:
          goto switchD_001f51a3_default;
        }
        (hw_regs->highpoc).reg200 = SVar18;
switchD_001f51a3_default:
        lVar19 = lVar19 + 1;
        if (lVar19 == 0x8b) {
          hal_h265d_v382_output_pps_packet(hal,(syn->dec).syntax.data);
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0xa1,*(RK_U32 *)((long)hal + 0x1fc));
          mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0xa3,*(RK_U32 *)((long)hal + 0x200));
          (hw_regs->common).reg013 =
               (SWREG13_EN_MODE_SET_conflict)
               ((uint)(hw_regs->common).reg013 & 0xfeffffff | (*(uint *)(dxva + 0xe) & 0x20000) << 7
               );
          pSVar4 = &(hw_regs->common).reg011;
          *(byte *)pSVar4 = *(byte *)pSVar4 | 0x40;
          hal_h265d_rcb_info_update(hal,dxva,hw_regs,local_3c,local_40);
          puVar24 = (undefined8 *)((long)hal + 0xe8);
          if (*(int *)((long)hal + 0x180) != 0) {
            puVar24 = puVar24 + (syn->dec).reg_index;
          }
          vdpu382_setup_rcb(local_58,*(MppDev *)((long)hal + 0x10),(MppBuffer)*puVar24,
                            (Vdpu382RcbInfo *)((long)hal + 100));
          local_70 = (MppFrame)0x0;
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)((long)hal + 0x20),(byte)dxva[3] & 0x7f,SLOT_FRAME_PTR,
                     &local_70);
          RVar29 = mpp_frame_get_thumbnail_en(local_70);
          if (RVar29 == 0) {
            (hw_regs->h265d_addr).reg198_scale_down_luma_base = 0;
            (hw_regs->h265d_addr).reg199_scale_down_chorme_base = 0;
            puVar1 = &(hw_regs->common).reg012.field_0x1;
            *puVar1 = *puVar1 & 0xfd;
          }
          else {
            RVar29 = (hw_regs->common_addr).reg130_decout_base;
            (hw_regs->h265d_addr).reg198_scale_down_luma_base = RVar29;
            (hw_regs->h265d_addr).reg199_scale_down_chorme_base = RVar29;
            vdpu382_setup_down_scale(local_70,*(MppDev *)((long)hal + 0x10),&hw_regs->common);
          }
          vdpu382_setup_statistic(&hw_regs->common,&hw_regs->statistic);
          mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x1c8),0,"hal_h265d_vdpu382_gen_regs");
          return MPP_OK;
        }
      } while( true );
    }
    if (((byte)hal_h265d_debug & 0x20) != 0) {
      _mpp_log_l(4,"hal_h265d_vdpu382","current frm may be err, should skip process",(char *)0x0);
    }
    *(byte *)&(syn->dec).flags = *(byte *)&(syn->dec).flags | 8;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h265d_vdpu382_gen_regs(void *hal,  HalTaskInfo *syn)
{
    RK_S32 i = 0;
    RK_S32 log2_min_cb_size;
    RK_S32 width, height;
    RK_S32 stride_y, stride_uv, virstrid_y;
    Vdpu382H265dRegSet *hw_regs;
    RK_S32 ret = MPP_SUCCESS;
    MppBuffer streambuf = NULL;
    RK_S32 aglin_offset = 0;
    RK_S32 valid_ref = -1;
    MppBuffer framebuf = NULL;
    HalBuf *mv_buf = NULL;
    RK_S32 fd = -1;
    RK_S32 distance = INT_MAX;
    h265d_dxva2_picture_context_t *dxva_cxt =
        (h265d_dxva2_picture_context_t *)syn->dec.syntax.data;
    HalH265dCtx *reg_ctx = ( HalH265dCtx *)hal;
    void *rps_ptr = NULL;
    RK_U32 stream_buf_size = 0;

    if (syn->dec.flags.parse_err ||
        (syn->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        return MPP_OK;
    }

    if (reg_ctx ->fast_mode) {
        for (i = 0; i < MAX_GEN_REG; i++) {
            if (!reg_ctx->g_buf[i].use_flag) {
                syn->dec.reg_index = i;

                reg_ctx->spspps_offset = reg_ctx->offset_spspps[i];
                reg_ctx->rps_offset = reg_ctx->offset_rps[i];
                reg_ctx->sclst_offset = reg_ctx->offset_sclst[i];

                reg_ctx->hw_regs = reg_ctx->g_buf[i].hw_regs;
                reg_ctx->g_buf[i].use_flag = 1;
                break;
            }
        }
        if (i == MAX_GEN_REG) {
            mpp_err("hevc rps buf all used");
            return MPP_ERR_NOMEM;
        }
    } else {
        syn->dec.reg_index = 0;
    }
    rps_ptr = mpp_buffer_get_ptr(reg_ctx->bufs) + reg_ctx->rps_offset;
    if (NULL == rps_ptr) {

        mpp_err("rps_data get ptr error");
        return MPP_ERR_NOMEM;
    }


    if (syn->dec.syntax.data == NULL) {
        mpp_err("%s:%s:%d dxva is NULL", __FILE__, __FUNCTION__, __LINE__);
        return MPP_ERR_NULL_PTR;
    }

    /* output pps */
    hw_regs = (Vdpu382H265dRegSet*)reg_ctx->hw_regs;
    memset(hw_regs, 0, sizeof(Vdpu382H265dRegSet));

    if (NULL == reg_ctx->hw_regs) {
        return MPP_ERR_NULL_PTR;
    }


    log2_min_cb_size = dxva_cxt->pp.log2_min_luma_coding_block_size_minus3 + 3;

    width = (dxva_cxt->pp.PicWidthInMinCbsY << log2_min_cb_size);
    height = (dxva_cxt->pp.PicHeightInMinCbsY << log2_min_cb_size);
    ret = hal_h265d_vdpu382_setup_colmv_buf(hal, syn);
    if (ret)
        return MPP_ERR_NOMEM;

    {
        MppFrame mframe = NULL;
        RK_U32 ver_virstride;

        mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);
        stride_y = mpp_frame_get_hor_stride(mframe);
        ver_virstride = mpp_frame_get_ver_stride(mframe);
        stride_uv = stride_y;
        virstrid_y = ver_virstride * stride_y;
        hw_regs->common.reg013.h26x_error_mode = 1;
        hw_regs->common.reg021.error_deb_en = 1;
        hw_regs->common.reg021.inter_error_prc_mode = 0;
        hw_regs->common.reg021.error_intra_mode = 1;

        hw_regs->common.reg017.slice_num = dxva_cxt->slice_count;
        hw_regs->h265d_param.reg64.h26x_rps_mode = 0;
        hw_regs->h265d_param.reg64.h26x_frame_orslice = 0;
        hw_regs->h265d_param.reg64.h26x_stream_mode = 0;

        if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
            RK_U32 fbc_hdr_stride = mpp_frame_get_fbc_hdr_stride(mframe);
            RK_U32 fbd_offset = MPP_ALIGN(fbc_hdr_stride * (ver_virstride + 64) / 16, SZ_4K);

            hw_regs->common.reg012.fbc_e = 1;
            hw_regs->common.reg018.y_hor_virstride = fbc_hdr_stride >> 4;
            hw_regs->common.reg019.uv_hor_virstride = fbc_hdr_stride >> 4;
            hw_regs->common.reg020_fbc_payload_off.payload_st_offset = fbd_offset >> 4;
        } else {
            hw_regs->common.reg012.fbc_e = 0;
            hw_regs->common.reg018.y_hor_virstride = stride_y >> 4;
            hw_regs->common.reg019.uv_hor_virstride = stride_uv >> 4;
            hw_regs->common.reg020_y_virstride.y_virstride = virstrid_y >> 4;
        }
    }
    mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                          SLOT_BUFFER, &framebuf);
    hw_regs->common_addr.reg130_decout_base  = mpp_buffer_get_fd(framebuf); //just index need map
    /*if out_base is equal to zero it means this frame may error
    we return directly add by csy*/

    if (hw_regs->common_addr.reg130_decout_base == 0) {
        return 0;
    }
    fd =  mpp_buffer_get_fd(framebuf);
    hw_regs->common_addr.reg130_decout_base = fd;
    mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, dxva_cxt->pp.CurrPic.Index7Bits);
    hw_regs->common_addr.reg131_colmv_cur_base = mpp_buffer_get_fd(mv_buf->buf[0]);

    hw_regs->h265d_param.reg65.cur_top_poc = dxva_cxt->pp.CurrPicOrderCntVal;

    mpp_buf_slot_get_prop(reg_ctx->packet_slots, syn->dec.input, SLOT_BUFFER,
                          &streambuf);
    if ( dxva_cxt->bitstream == NULL) {
        dxva_cxt->bitstream = mpp_buffer_get_ptr(streambuf);
    }
#ifdef HW_RPS
    hw_regs->h265d_param.reg103.ref_pic_layer_same_with_cur = 0xffff;
    hal_h265d_slice_hw_rps(syn->dec.syntax.data, rps_ptr, reg_ctx->sw_rps_buf, reg_ctx->fast_mode);
#else
    hw_regs->sw_sysctrl.sw_h26x_rps_mode = 1;
    hal_h265d_slice_output_rps(syn->dec.syntax.data, rps_ptr);
#endif

    /* cabac table */
    hw_regs->h265d_addr.reg197_cabactbl_base    = reg_ctx->bufs_fd;
    /* pps */
    hw_regs->h265d_addr.reg161_pps_base         = reg_ctx->bufs_fd;
    hw_regs->h265d_addr.reg163_rps_base         = reg_ctx->bufs_fd;

    hw_regs->common_addr.reg128_rlc_base        = mpp_buffer_get_fd(streambuf);
    hw_regs->common_addr.reg129_rlcwrite_base   = mpp_buffer_get_fd(streambuf);
    stream_buf_size                             = mpp_buffer_get_size(streambuf);
    hw_regs->common.reg016_str_len              = ((dxva_cxt->bitstream_size + 15)
                                                   & (~15)) + 64;
    hw_regs->common.reg016_str_len = stream_buf_size > hw_regs->common.reg016_str_len ?
                                     hw_regs->common.reg016_str_len : stream_buf_size;

    aglin_offset =  hw_regs->common.reg016_str_len - dxva_cxt->bitstream_size;
    if (aglin_offset > 0) {
        memset((void *)(dxva_cxt->bitstream + dxva_cxt->bitstream_size), 0,
               aglin_offset);
    }
    hw_regs->common.reg010.dec_e                = 1;
    hw_regs->common.reg012.colmv_compress_en = reg_ctx->hw_info ?
                                               reg_ctx->hw_info->cap_colmv_compress : 0;

    hw_regs->common.reg024.cabac_err_en_lowbits = 0xffffdfff;
    hw_regs->common.reg025.cabac_err_en_highbits = 0x3ffbf9ff;

    hw_regs->common.reg011.dec_clkgate_e    = 1;
    hw_regs->common.reg011.err_head_fill_e  = 1;
    hw_regs->common.reg011.err_colmv_fill_e = 1;

    hw_regs->common.reg026.inter_auto_gating_e = 1;
    hw_regs->common.reg026.filterd_auto_gating_e = 1;
    hw_regs->common.reg026.strmd_auto_gating_e = 1;
    hw_regs->common.reg026.mcp_auto_gating_e = 1;
    hw_regs->common.reg026.busifd_auto_gating_e = 1;
    hw_regs->common.reg026.dec_ctrl_auto_gating_e = 1;
    hw_regs->common.reg026.intra_auto_gating_e = 1;
    hw_regs->common.reg026.mc_auto_gating_e = 1;
    hw_regs->common.reg026.transd_auto_gating_e = 1;
    hw_regs->common.reg026.sram_auto_gating_e = 1;
    hw_regs->common.reg026.cru_auto_gating_e = 1;
    hw_regs->common.reg026.reg_cfg_gating_en = 1;
    hw_regs->common.reg032_timeout_threshold = 0x3ffff;

    valid_ref = hw_regs->common_addr.reg130_decout_base;
    reg_ctx->error_index[syn->dec.reg_index] = dxva_cxt->pp.CurrPic.Index7Bits;
    hw_regs->common_addr.reg132_error_ref_base = valid_ref;

    memset(&hw_regs->highpoc.reg205, 0, sizeof(RK_U32));

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {
        if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff &&
            dxva_cxt->pp.RefPicList[i].bPicEntry != 0x7f) {

            MppFrame mframe = NULL;
            hw_regs->h265d_param.reg67_82_ref_poc[i] = dxva_cxt->pp.PicOrderCntValList[i];
            mpp_buf_slot_get_prop(reg_ctx->slots,
                                  dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_BUFFER, &framebuf);
            mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_FRAME_PTR, &mframe);
            if (framebuf != NULL) {
                hw_regs->h265d_addr.reg164_179_ref_base[i] = mpp_buffer_get_fd(framebuf);
                valid_ref = hw_regs->h265d_addr.reg164_179_ref_base[i];
                // mpp_log("cur poc %d, ref poc %d", dxva_cxt->pp.current_poc, dxva_cxt->pp.PicOrderCntValList[i]);
                if ((pocdistance(dxva_cxt->pp.PicOrderCntValList[i], dxva_cxt->pp.current_poc) < distance)
                    && (!mpp_frame_get_errinfo(mframe))) {
                    distance = pocdistance(dxva_cxt->pp.PicOrderCntValList[i], dxva_cxt->pp.current_poc);
                    hw_regs->common_addr.reg132_error_ref_base = hw_regs->h265d_addr.reg164_179_ref_base[i];
                    reg_ctx->error_index[syn->dec.reg_index] = dxva_cxt->pp.RefPicList[i].Index7Bits;
                    hw_regs->common.reg021.error_intra_mode = 0;

                }
            } else {
                hw_regs->h265d_addr.reg164_179_ref_base[i] = valid_ref;
            }

            mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, dxva_cxt->pp.RefPicList[i].Index7Bits);
            hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);

            SET_REF_VALID(hw_regs->h265d_param, i, 1);
        }
    }

    if ((reg_ctx->error_index[syn->dec.reg_index] == dxva_cxt->pp.CurrPic.Index7Bits) &&
        !dxva_cxt->pp.IntraPicFlag) {
        h265h_dbg(H265H_DBG_TASK_ERR, "current frm may be err, should skip process");
        syn->dec.flags.ref_err = 1;
        return MPP_OK;
    }

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {

        if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff &&
            dxva_cxt->pp.RefPicList[i].bPicEntry != 0x7f) {
            MppFrame mframe = NULL;

            mpp_buf_slot_get_prop(reg_ctx->slots,
                                  dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_BUFFER, &framebuf);

            mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_FRAME_PTR, &mframe);

            if (framebuf == NULL || mpp_frame_get_errinfo(mframe)) {
                mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, reg_ctx->error_index[syn->dec.reg_index]);
                hw_regs->h265d_addr.reg164_179_ref_base[i] = hw_regs->common_addr.reg132_error_ref_base;
                hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
            }
        } else {
            mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, reg_ctx->error_index[syn->dec.reg_index]);
            hw_regs->h265d_addr.reg164_179_ref_base[i] = hw_regs->common_addr.reg132_error_ref_base;
            hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
            /* mark 3 to differ from current frame */
            if (reg_ctx->error_index[syn->dec.reg_index] == dxva_cxt->pp.CurrPic.Index7Bits)
                SET_POC_HIGNBIT_INFO(hw_regs->highpoc, i, poc_highbit, 3);
        }
    }
    hal_h265d_v382_output_pps_packet(hal, syn->dec.syntax.data);

    mpp_dev_set_reg_offset(reg_ctx->dev, 161, reg_ctx->spspps_offset);
    /* rps */
    mpp_dev_set_reg_offset(reg_ctx->dev, 163, reg_ctx->rps_offset);

    hw_regs->common.reg013.cur_pic_is_idr = dxva_cxt->pp.IdrPicFlag;//p_hal->slice_long->idr_flag;

    hw_regs->common.reg011.buf_empty_en = 1;

    hal_h265d_rcb_info_update(hal, dxva_cxt, hw_regs, width, height);
    vdpu382_setup_rcb(&hw_regs->common_addr, reg_ctx->dev, reg_ctx->fast_mode ?
                      reg_ctx->rcb_buf[syn->dec.reg_index] : reg_ctx->rcb_buf[0],
                      (Vdpu382RcbInfo*)reg_ctx->rcb_info);
    {
        MppFrame mframe = NULL;

        mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);

        if (mpp_frame_get_thumbnail_en(mframe)) {
            hw_regs->h265d_addr.reg198_scale_down_luma_base =
                hw_regs->common_addr.reg130_decout_base;
            hw_regs->h265d_addr.reg199_scale_down_chorme_base =
                hw_regs->common_addr.reg130_decout_base;
            vdpu382_setup_down_scale(mframe, reg_ctx->dev, &hw_regs->common);
        } else {
            hw_regs->h265d_addr.reg198_scale_down_luma_base = 0;
            hw_regs->h265d_addr.reg199_scale_down_chorme_base = 0;
            hw_regs->common.reg012.scale_down_en = 0;
        }
    }
    vdpu382_setup_statistic(&hw_regs->common, &hw_regs->statistic);
    mpp_buffer_sync_end(reg_ctx->bufs);

    return ret;
}